

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix_test.cc
# Opt level: O0

void __thiscall
leveldb::EnvPosixTest_TestCloseOnExecRandomAccessFile_Test::
EnvPosixTest_TestCloseOnExecRandomAccessFile_Test
          (EnvPosixTest_TestCloseOnExecRandomAccessFile_Test *this)

{
  EnvPosixTest_TestCloseOnExecRandomAccessFile_Test *this_local;
  
  EnvPosixTest::EnvPosixTest(&this->super_EnvPosixTest);
  (this->super_EnvPosixTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EnvPosixTest_TestCloseOnExecRandomAccessFile_Test_001ad540;
  return;
}

Assistant:

TEST_F(EnvPosixTest, TestCloseOnExecRandomAccessFile) {
  std::unordered_set<int> open_fds;
  GetOpenFileDescriptors(&open_fds);

  std::string test_dir;
  ASSERT_LEVELDB_OK(env_->GetTestDirectory(&test_dir));
  std::string file_path = test_dir + "/close_on_exec_random_access.txt";
  ASSERT_LEVELDB_OK(WriteStringToFile(env_, "0123456789", file_path));

  // Exhaust the RandomAccessFile mmap limit. This way, the test
  // RandomAccessFile instance below is backed by a file descriptor, not by an
  // mmap region.
  leveldb::RandomAccessFile* mmapped_files[kReadOnlyFileLimit] = {nullptr};
  for (int i = 0; i < kReadOnlyFileLimit; i++) {
    ASSERT_LEVELDB_OK(env_->NewRandomAccessFile(file_path, &mmapped_files[i]));
  }

  leveldb::RandomAccessFile* file = nullptr;
  ASSERT_LEVELDB_OK(env_->NewRandomAccessFile(file_path, &file));
  CheckCloseOnExecDoesNotLeakFDs(open_fds);
  delete file;

  for (int i = 0; i < kReadOnlyFileLimit; i++) {
    delete mmapped_files[i];
  }
  ASSERT_LEVELDB_OK(env_->RemoveFile(file_path));
}